

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::SamePadding::_InternalSerialize
          (SamePadding *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  undefined8 *puVar7;
  size_t __n;
  
  puVar6 = target;
  if (this->asymmetrymode_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar1 = this->asymmetrymode_;
    *target = '\b';
    target[1] = (byte)uVar1;
    if ((ulong)(long)(int)uVar1 < 0x80) {
      puVar6 = target + 2;
    }
    else {
      target[1] = (byte)uVar1 | 0x80;
      uVar3 = (ulong)(long)(int)uVar1 >> 7;
      target[2] = (uint8_t)uVar3;
      puVar6 = target + 3;
      if (0x3fff < uVar1) {
        uVar5 = (ulong)target[2];
        do {
          puVar6[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *puVar6 = (uint8_t)uVar4;
          puVar6 = puVar6 + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar2);
      }
    }
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    data = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar7 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar7[1];
    if ((long)stream->end_ - (long)puVar6 < (long)__n) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar7[1],puVar6);
      return puVar6;
    }
    memcpy(puVar6,data,__n);
    puVar6 = puVar6 + __n;
  }
  return puVar6;
}

Assistant:

uint8_t* SamePadding::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SamePadding)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.SamePadding.SamePaddingMode asymmetryMode = 1;
  if (this->_internal_asymmetrymode() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_asymmetrymode(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SamePadding)
  return target;
}